

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_greedy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  char cVar5;
  undefined8 uVar6;
  int *piVar7;
  int iVar8;
  size_t sVar9;
  BYTE *pBVar10;
  seqDef *psVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  BYTE *pBVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  U32 UVar21;
  ulong uVar22;
  BYTE *litEnd;
  ulong uVar23;
  int *iend;
  BYTE *litEnd_1;
  U32 UVar24;
  U32 UVar25;
  size_t ofbCandidate;
  U32 maxDistance;
  BYTE *litLimit_w;
  U32 local_ac;
  size_t local_a0;
  BYTE *local_98;
  uint local_8c;
  uint local_88;
  uint local_84;
  ulong local_80;
  int *local_78;
  int local_70;
  uint local_6c;
  int *local_68;
  BYTE *local_60;
  BYTE *local_58;
  int local_4c;
  BYTE *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar4 = (ms->window).base;
  local_60 = (ms->window).dictBase;
  uVar13 = (ms->window).dictLimit;
  local_80 = (ulong)uVar13;
  local_84 = (ms->cParams).minMatch;
  if (5 < local_84) {
    local_84 = 6;
  }
  if (local_84 < 5) {
    local_84 = 4;
  }
  local_6c = (ms->cParams).searchLog;
  local_88 = 6;
  if (local_6c < 6) {
    local_88 = local_6c;
  }
  uVar14 = (ms->window).lowLimit;
  if (local_88 < 5) {
    local_88 = 4;
  }
  uVar2 = (ms->cParams).windowLog;
  UVar25 = *rep;
  local_ac = rep[1];
  ms->lazySkipping = 0;
  local_58 = pBVar4 + local_80;
  piVar17 = (int *)((ulong)(local_58 == (BYTE *)src) + (long)src);
  local_78 = (int *)((long)src + (srcSize - 0x10));
  uVar3 = ms->nextToUpdate;
  uVar19 = (ulong)uVar3;
  uVar20 = ((int)local_78 - (int)(pBVar4 + uVar19)) + 1;
  uVar12 = 8;
  if (uVar20 < 8) {
    uVar12 = uVar20;
  }
  if (local_78 < pBVar4 + uVar19) {
    uVar12 = 0;
  }
  if (uVar3 < uVar12 + uVar3) {
    uVar18 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    do {
      if (local_84 == 5) {
        uVar23 = *(long *)(pBVar4 + uVar19) * -0x30e4432345000000;
LAB_00363aa6:
        UVar24 = (U32)((uVar23 ^ uVar18) >> (0x38U - cVar5 & 0x3f));
      }
      else {
        if (local_84 == 6) {
          uVar23 = *(long *)(pBVar4 + uVar19) * -0x30e4432340650000;
          goto LAB_00363aa6;
        }
        UVar24 = (*(int *)(pBVar4 + uVar19) * -0x61c8864f ^ (uint)uVar18) >> (0x18U - cVar5 & 0x1f);
      }
      ms->hashCache[(uint)uVar19 & 7] = UVar24;
      uVar19 = uVar19 + 1;
    } while (uVar12 + uVar3 != uVar19);
  }
  local_98 = (BYTE *)(srcSize + (long)src);
  local_38 = rep;
  if (piVar17 < local_78) {
    local_8c = 1 << ((byte)uVar2 & 0x1f);
    local_40 = local_60 + local_80;
    local_48 = local_60 + uVar14;
    local_70 = uVar13 - 1;
    local_68 = (int *)(local_98 + -0x20);
    do {
      iVar8 = ((int)piVar17 - (int)pBVar4) + 1;
      UVar24 = (ms->window).lowLimit;
      UVar21 = iVar8 - local_8c;
      if (iVar8 - UVar24 <= local_8c) {
        UVar21 = UVar24;
      }
      if (ms->loadedDictEnd != 0) {
        UVar21 = UVar24;
      }
      uVar13 = iVar8 - UVar25;
      pBVar15 = pBVar4;
      if (uVar13 < (uint)local_80) {
        pBVar15 = local_60;
      }
      iend = (int *)((long)piVar17 + 1);
      UVar24 = UVar25;
      if (((local_70 - uVar13 < 3) || (iVar8 - UVar21 < UVar25)) ||
         (*iend != *(int *)(pBVar15 + uVar13))) {
        local_a0 = 999999999;
        if (local_84 == 6) {
          if (local_88 == 6) {
            uVar19 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)piVar17,local_98,&local_a0);
          }
          else if (local_88 == 5) {
            uVar19 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)piVar17,local_98,&local_a0);
          }
          else {
            uVar19 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)piVar17,local_98,&local_a0);
          }
        }
        else if (local_84 == 5) {
          if (local_88 == 6) {
            uVar19 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)piVar17,local_98,&local_a0);
          }
          else if (local_88 == 5) {
            uVar19 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)piVar17,local_98,&local_a0);
          }
          else {
            uVar19 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)piVar17,local_98,&local_a0);
          }
        }
        else if (local_88 == 6) {
          uVar19 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)piVar17,local_98,&local_a0);
        }
        else if (local_88 == 5) {
          uVar19 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)piVar17,local_98,&local_a0);
        }
        else {
          uVar19 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)piVar17,local_98,&local_a0);
        }
        uVar18 = local_a0;
        piVar7 = piVar17;
        if (uVar19 == 0) {
          uVar18 = 1;
          piVar7 = iend;
        }
        iend = piVar7;
        UVar21 = (U32)uVar18;
        if (3 < uVar19) {
          if (3 < local_a0) {
            uVar18 = (long)piVar17 + (3 - (long)(pBVar4 + local_a0));
            pBVar10 = local_58;
            pBVar15 = pBVar4;
            if ((uint)uVar18 < (uint)local_80) {
              pBVar10 = local_48;
              pBVar15 = local_60;
            }
            if ((src < piVar17) && (uVar18 = uVar18 & 0xffffffff, pBVar10 < pBVar15 + uVar18)) {
              pBVar15 = pBVar15 + uVar18;
              do {
                piVar17 = (int *)((long)iend + -1);
                pBVar15 = pBVar15 + -1;
                if ((*(BYTE *)piVar17 != *pBVar15) ||
                   (uVar19 = uVar19 + 1, iend = piVar17, piVar17 <= src)) break;
              } while (pBVar10 < pBVar15);
            }
            UVar24 = UVar21 - 3;
            local_ac = UVar25;
          }
          goto LAB_00363ddf;
        }
        uVar19 = (long)piVar17 - (long)src;
        piVar17 = (int *)((long)piVar17 + (uVar19 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar19);
      }
      else {
        pBVar10 = local_98;
        if (uVar13 < (uint)local_80) {
          pBVar10 = local_40;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar17 + 5),(BYTE *)((long)(pBVar15 + uVar13) + 4),
                           local_98,pBVar10,local_58);
        uVar19 = sVar9 + 4;
        UVar21 = 1;
LAB_00363ddf:
        uVar18 = (long)iend - (long)src;
        pBVar15 = seqStore->lit;
        if (local_68 < iend) {
          ZSTD_safecopyLiterals(pBVar15,(BYTE *)src,(BYTE *)iend,(BYTE *)local_68);
LAB_00363e04:
          seqStore->lit = seqStore->lit + uVar18;
          psVar11 = seqStore->sequences;
          if (0xffff < uVar18) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar6 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar15 = *src;
          *(undefined8 *)(pBVar15 + 8) = uVar6;
          pBVar15 = seqStore->lit;
          if (0x10 < uVar18) {
            uVar6 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar15 + 0x18) = uVar6;
            if (0x20 < (long)uVar18) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x20);
                uVar6 = puVar1[1];
                pBVar10 = pBVar15 + lVar16 + 0x20;
                *(undefined8 *)pBVar10 = *puVar1;
                *(undefined8 *)(pBVar10 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar10 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar10 + 0x18) = uVar6;
                lVar16 = lVar16 + 0x20;
              } while (pBVar10 + 0x20 < pBVar15 + uVar18);
            }
            goto LAB_00363e04;
          }
          seqStore->lit = pBVar15 + uVar18;
          psVar11 = seqStore->sequences;
        }
        psVar11->litLength = (U16)uVar18;
        psVar11->offBase = UVar21;
        if (0xffff < uVar19 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar11->mlBase = (U16)(uVar19 - 3);
        seqStore->sequences = psVar11 + 1;
        if (ms->lazySkipping != 0) {
          uVar13 = ms->nextToUpdate;
          uVar18 = (ulong)uVar13;
          uVar14 = ((int)local_78 - (int)(pBVar4 + uVar18)) + 1;
          if (7 < uVar14) {
            uVar14 = 8;
          }
          if (local_78 < pBVar4 + uVar18) {
            uVar14 = 0;
          }
          if (uVar13 < uVar14 + uVar13) {
            UVar25 = ms->rowHashLog;
            uVar23 = ms->hashSalt;
            local_4c = 0x18 - UVar25;
            do {
              if (local_84 == 5) {
                uVar22 = *(long *)(pBVar4 + uVar18) * -0x30e4432345000000;
LAB_00363f77:
                UVar21 = (U32)((uVar22 ^ uVar23) >> (0x38U - (char)UVar25 & 0x3f));
              }
              else {
                if (local_84 == 6) {
                  uVar22 = *(long *)(pBVar4 + uVar18) * -0x30e4432340650000;
                  goto LAB_00363f77;
                }
                UVar21 = (*(int *)(pBVar4 + uVar18) * -0x61c8864f ^ (uint)uVar23) >>
                         ((byte)local_4c & 0x1f);
              }
              ms->hashCache[(uint)uVar18 & 7] = UVar21;
              uVar18 = uVar18 + 1;
            } while (uVar14 + uVar13 != uVar18);
          }
          ms->lazySkipping = 0;
        }
        piVar17 = (int *)((long)iend + uVar19);
        src = piVar17;
        UVar25 = UVar24;
        if (piVar17 <= local_78) {
          do {
            uVar13 = local_ac;
            iVar8 = (int)piVar17 - (int)pBVar4;
            UVar25 = (ms->window).lowLimit;
            UVar21 = iVar8 - local_8c;
            if (iVar8 - UVar25 <= local_8c) {
              UVar21 = UVar25;
            }
            if (ms->loadedDictEnd != 0) {
              UVar21 = UVar25;
            }
            uVar14 = iVar8 - uVar13;
            pBVar15 = pBVar4;
            if (uVar14 < (uint)local_80) {
              pBVar15 = local_60;
            }
            src = piVar17;
            UVar25 = UVar24;
            local_ac = uVar13;
            if (((local_70 - uVar14 < 3) || (iVar8 - UVar21 < uVar13)) ||
               (*piVar17 != *(int *)(pBVar15 + uVar14))) break;
            pBVar10 = local_98;
            if (uVar14 < (uint)local_80) {
              pBVar10 = local_40;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar17 + 1),(BYTE *)((long)(pBVar15 + uVar14) + 4),local_98
                               ,pBVar10,local_58);
            pBVar15 = seqStore->lit;
            if (local_68 < piVar17) {
              ZSTD_safecopyLiterals(pBVar15,(BYTE *)piVar17,(BYTE *)piVar17,(BYTE *)local_68);
            }
            else {
              uVar6 = *(undefined8 *)(piVar17 + 2);
              *(undefined8 *)pBVar15 = *(undefined8 *)piVar17;
              *(undefined8 *)(pBVar15 + 8) = uVar6;
            }
            psVar11 = seqStore->sequences;
            psVar11->litLength = 0;
            psVar11->offBase = 1;
            if (0xffff < sVar9 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar11->mlBase = (U16)(sVar9 + 1);
            seqStore->sequences = psVar11 + 1;
            piVar17 = (int *)((long)piVar17 + sVar9 + 4);
            src = piVar17;
            UVar25 = uVar13;
            local_ac = UVar24;
            UVar24 = uVar13;
          } while (piVar17 <= local_78);
        }
      }
    } while (piVar17 < local_78);
  }
  *local_38 = UVar25;
  local_38[1] = local_ac;
  return (long)local_98 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0);
}